

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O0

drwav_uint64 drwav_write(drwav *pWav,drwav_uint64 samplesToWrite,void *pData)

{
  size_t sVar1;
  size_t bytesWritten;
  drwav_uint64 bytesToWrite;
  void *pData_local;
  drwav_uint64 samplesToWrite_local;
  drwav *pWav_local;
  
  if (((pWav == (drwav *)0x0) || (samplesToWrite == 0)) || (pData == (void *)0x0)) {
    pWav_local = (drwav *)0x0;
  }
  else {
    sVar1 = drwav_write_raw(pWav,samplesToWrite * pWav->bitsPerSample >> 3,pData);
    pWav_local = (drwav *)((sVar1 << 3) / (ulong)pWav->bitsPerSample);
  }
  return (drwav_uint64)pWav_local;
}

Assistant:

drwav_uint64 drwav_write(drwav* pWav, drwav_uint64 samplesToWrite, const void* pData) {
    if (pWav == NULL || samplesToWrite == 0 || pData == NULL) {
        return 0;
    }

    drwav_uint64 bytesToWrite = ((samplesToWrite * pWav->bitsPerSample) / 8);
    if (bytesToWrite > SIZE_MAX) {
        return 0;
    }

    size_t bytesWritten = drwav_write_raw(pWav, (size_t)bytesToWrite, pData);
    return ((drwav_uint64)bytesWritten * 8) / pWav->bitsPerSample;
}